

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * GenerateKBI19Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  pointer this;
  initializer_list<unsigned_char> __l;
  allocator_type local_f9;
  int local_f8;
  uint local_f4;
  Data data;
  vector<unsigned_char,std::allocator<unsigned_char>> local_c8 [24];
  BitstreamTrackBuilder bitbuf;
  
  bVar4 = IsKBI19Track(track);
  if (bVar4) {
    if (GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig == '\0') {
      iVar5 = __cxa_guard_acquire(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig);
      if (iVar5 != 0) {
        bitbuf.super_TrackBuilder._vptr_TrackBuilder._0_4_ = 0x49424b20;
        bitbuf.super_TrackBuilder._vptr_TrackBuilder._4_1_ = 0x20;
        __l._M_len = 5;
        __l._M_array = (iterator)&bitbuf;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&GenerateKBI19Track::gap2_sig.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__l,
                   (allocator_type *)&data);
        __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                     &GenerateKBI19Track::gap2_sig,&__dso_handle);
        __cxa_guard_release(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig);
      }
    }
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x40,-1);
    TrackBuilder::addIAM(&bitbuf.super_TrackBuilder);
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x32,-1);
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_f8 = 0;
    local_f4 = 0;
    while( true ) {
      uVar2 = local_f4 / 3;
      if (this == pSVar1) break;
      TrackBuilder::addSectorHeader(&bitbuf.super_TrackBuilder,&this->header,false);
      if ((this->header).sector == 0) {
        TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x11,-1);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,&GenerateKBI19Track::gap2_sig);
      }
      else {
        TrackBuilder::addGap(&bitbuf.super_TrackBuilder,8,-1);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,&GenerateKBI19Track::gap2_sig);
        TrackBuilder::addGap(&bitbuf.super_TrackBuilder,9,-1);
      }
      TrackBuilder::addAM(&bitbuf.super_TrackBuilder,(uint)this->dam,false);
      __x = &Sector::data_copy(this,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__x);
      if (uVar2 * 3 + local_f8 == 0) {
        if ((this->header).sector == 0) {
          iVar5 = Sector::size(this);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar5);
          TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,&data);
          BitstreamTrackBuilder::addCrc(&bitbuf,0x204);
        }
        else {
          iVar5 = Sector::size(this);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (local_c8,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x10e),&local_f9);
          TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,(Data *)local_c8);
          iVar5 = iVar5 + 4;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
          BitstreamTrackBuilder::addCrc(&bitbuf,iVar5);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (local_c8,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x110),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x187),&local_f9);
          TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,(Data *)local_c8);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
          BitstreamTrackBuilder::addCrc(&bitbuf,iVar5);
          puVar3 = data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar6 = Sector::size(this);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (local_c8,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )(puVar3 + 0x189),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(puVar3 + iVar6),&local_f9);
          TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,(Data *)local_c8);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
          BitstreamTrackBuilder::addCrc(&bitbuf,iVar5);
          TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x50,-1);
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x3d);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,&data);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      this = this + 1;
      local_f8 = local_f8 + -1;
      local_f4 = local_f4 + 1;
    }
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x5a,-1);
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("IsKBI19Track(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x3a,"TrackData GenerateKBI19Track(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateKBI19Track(const CylHead& cylhead, const Track& track)
{
    assert(IsKBI19Track(track));

    static const Data gap2_sig{ 0x20,0x4B,0x42,0x49,0x20 }; // " KBI "
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);

    // Track start with slightly shorter gap4a.
    bitbuf.addGap(64);
    bitbuf.addIAM();
    bitbuf.addGap(50);

    int sector_index = 0;
    for (auto& s : track)
    {
        bitbuf.addSectorHeader(s.header);

        if (s.header.sector == 0)
        {
            bitbuf.addGap(17);
            bitbuf.addBlock(gap2_sig);
        }
        else
        {
            bitbuf.addGap(8);
            bitbuf.addBlock(gap2_sig);
            bitbuf.addGap(9);
        }

        bitbuf.addAM(s.dam);
        auto data = s.data_copy();

        // Short or full sector data?
        if (sector_index++ % 3)
        {
            data.resize(61);
            bitbuf.addBlock(data);
        }
        else
        {
            if (s.header.sector == 0)
            {
                data.resize(s.size());
                bitbuf.addBlock(data);
                bitbuf.addCrc(3 + 1 + 512);
            }
            else
            {
                auto crc_block_size = 3 + 1 + s.size();
                bitbuf.addBlock({ data.begin() + 0, data.begin() + 0x10e });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x110, data.begin() + 0x187 });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x189, data.begin() + s.size() });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addGap(80);
            }
        }
    }

    // Pad up to normal track size.
    bitbuf.addGap(90);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}